

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O3

void opengv::generateRandom2D3DCorrespondences
               (translation_t *position,rotation_t *rotation,translations_t *camOffsets,
               rotations_t *camRotations,size_t numberPoints,double noise,double outlierFraction,
               bearingVectors_t *bearingVectors,points_t *points,
               vector<int,_std::allocator<int>_> *camCorrespondences,MatrixXd *gt)

{
  pointer *ppMVar1;
  double *pdVar2;
  int iVar3;
  double *pdVar4;
  pointer pMVar5;
  pointer pMVar6;
  iterator iVar7;
  iterator __position;
  pointer pMVar8;
  long lVar9;
  translations_t *ptVar10;
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  *pvVar11;
  rotations_t *prVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  void *__ptr;
  undefined8 *puVar16;
  ulong uVar17;
  long lVar18;
  SrcEvaluatorType srcEvaluator;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM5 [64];
  Vector3d local_138;
  double local_120;
  translations_t *local_118;
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  *local_110;
  rotations_t *local_108;
  double local_100;
  undefined1 local_f8 [16];
  double local_e8;
  double dStack_e0;
  undefined1 local_d8 [16];
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  size_t local_80;
  double local_78;
  ulong local_70;
  translation_t *local_68;
  double local_60;
  double local_58;
  double dStack_50;
  Vector3d local_48;
  
  auVar37 = in_ZMM5._0_16_;
  local_118 = camOffsets;
  local_110 = (vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
               *)bearingVectors;
  local_108 = camRotations;
  local_100 = noise;
  local_80 = numberPoints;
  local_78 = outlierFraction;
  if ((gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols != 0)
  {
    lVar22 = 0;
    uVar23 = 0;
    do {
      in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
      generateRandomPoint(&local_138,8.0,4.0);
      auVar37 = in_ZMM5._0_16_;
      uVar24 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows;
      pdVar4 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      uVar19 = uVar24;
      if ((((ulong)(pdVar4 + uVar24 * uVar23) & 7) == 0) &&
         (uVar19 = (ulong)(-((uint)((ulong)(pdVar4 + uVar24 * uVar23) >> 3) & 0x1fffffff) & 7),
         (long)uVar24 <= (long)uVar19)) {
        uVar19 = uVar24;
      }
      uVar20 = uVar24 - uVar19;
      uVar17 = uVar20 + 7;
      if (-1 < (long)uVar20) {
        uVar17 = uVar20;
      }
      if (0 < (long)uVar19) {
        uVar21 = 0;
        do {
          *(double *)((long)pdVar4 + uVar21 * 8 + uVar24 * lVar22) =
               local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[uVar21];
          uVar21 = uVar21 + 1;
        } while (uVar19 != uVar21);
      }
      uVar17 = (uVar17 & 0xfffffffffffffff8) + uVar19;
      if (7 < (long)uVar20) {
        do {
          dVar33 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[uVar19 + 1];
          dVar26 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[uVar19 + 2];
          dVar29 = (&local_120)[uVar19];
          ptVar10 = (&local_118)[uVar19];
          pvVar11 = (&local_110)[uVar19];
          prVar12 = (&local_108)[uVar19];
          dVar13 = *(double *)(local_f8 + uVar19 * 8 + -8);
          pdVar2 = (double *)((long)pdVar4 + uVar19 * 8 + uVar24 * lVar22);
          *pdVar2 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data.array[uVar19];
          pdVar2[1] = dVar33;
          pdVar2[2] = dVar26;
          pdVar2[3] = dVar29;
          pdVar2[4] = (double)ptVar10;
          pdVar2[5] = (double)pvVar11;
          pdVar2[6] = (double)prVar12;
          pdVar2[7] = dVar13;
          uVar19 = uVar19 + 8;
        } while ((long)uVar19 < (long)uVar17);
      }
      if ((long)uVar17 < (long)uVar24) {
        do {
          *(double *)((long)pdVar4 + uVar17 * 8 + uVar24 * lVar22) =
               local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[uVar17];
          uVar17 = uVar17 + 1;
        } while (uVar24 != uVar17);
      }
      uVar24 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols;
      uVar23 = uVar23 + 1;
      lVar22 = lVar22 + 8;
    } while (uVar23 < uVar24);
    if (uVar24 != 0) {
      local_120 = 0.0;
      uVar24 = 0;
      uVar23 = 0;
      local_70 = ((long)(local_118->
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_118->
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 1;
      do {
        auVar37 = in_ZMM5._0_16_;
        pMVar5 = (local_118->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_f8 = *(undefined1 (*) [16])
                    &pMVar5[uVar23].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data;
        local_c8 = *(double *)
                    ((long)&pMVar5[uVar23].
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data + 0x10);
        pMVar6 = (local_108->
                 super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_e8 = pMVar6[uVar23].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                   m_storage.m_data.array[0];
        dStack_e0 = *(double *)
                     ((long)&pMVar6[uVar23].
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                             m_data + 8);
        local_b8 = *(double *)
                    ((long)&pMVar6[uVar23].
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data + 0x10);
        dStack_b0 = 0.0;
        pdVar4 = (double *)
                 ((long)&pMVar6[uVar23].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                         .m_storage.m_data + 0x18);
        local_58 = *pdVar4;
        dStack_50 = pdVar4[1];
        local_d8._8_8_ = 0;
        local_d8._0_8_ =
             *(double *)
              ((long)&pMVar6[uVar23].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data + 0x28);
        pdVar4 = (double *)
                 ((long)&pMVar6[uVar23].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                         .m_storage.m_data + 0x30);
        local_a8 = *pdVar4;
        dStack_a0 = pdVar4[1];
        local_98 = *(double *)
                    ((long)&pMVar6[uVar23].
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data + 0x40);
        pdVar2 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data;
        lVar22 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_rows * uVar24;
        pdVar4 = pdVar2 + lVar22;
        dVar33 = *pdVar4;
        local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = pdVar4[1];
        local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0]._0_4_ = SUB84(dVar33,0);
        local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0]._4_4_ = (undefined4)((ulong)dVar33 >> 0x20);
        local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = pdVar2[lVar22 + 2];
        iVar7._M_current =
             (points->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (points->
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
          ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                    ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                      *)points,iVar7,&local_138);
        }
        else {
          ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[2] =
               local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
          ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[0] = dVar33;
          ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[1] =
               local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
          ppMVar1 = &(points->
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppMVar1 = *ppMVar1 + 1;
        }
        pdVar4 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data;
        lVar22 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_rows;
        in_ZMM5 = ZEXT1664(auVar37);
        __ptr = malloc(0x58);
        if (__ptr == (void *)0x0) {
          puVar16 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar16 = acos;
          __cxa_throw(puVar16,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        uVar19 = (ulong)__ptr & 0xffffffffffffffc0;
        lVar18 = 0;
        *(void **)(uVar19 + 0x38) = __ptr;
        do {
          *(double *)(uVar19 + 0x40 + lVar18 * 8) =
               *(double *)((long)pdVar4 + lVar18 * 8 + lVar22 * (long)local_120) -
               (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[lVar18];
          lVar18 = lVar18 + 1;
        } while (lVar18 != 3);
        dVar26 = *(double *)(uVar19 + 0x40);
        dVar29 = *(double *)(uVar19 + 0x48);
        dVar33 = *(double *)(uVar19 + 0x50);
        auVar37 = vmovhpd_avx(*(undefined1 (*) [16])
                               ((rotation->
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array + 2),
                              (rotation->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[5]);
        auVar30._0_8_ =
             dVar26 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[0] +
             dVar29 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[1] + dVar33 * auVar37._0_8_;
        auVar30._8_8_ =
             dVar26 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[3] +
             dVar29 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                      m_storage.m_data.array[4] + dVar33 * auVar37._8_8_;
        local_f8 = vsubpd_avx(auVar30,local_f8);
        local_60 = dVar33 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                            .m_storage.m_data.array[8] +
                   dVar26 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                            .m_storage.m_data.array[6] +
                   dVar29 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                            .m_storage.m_data.array[7];
        free(__ptr);
        pvVar11 = local_110;
        dVar33 = local_60 - local_c8;
        auVar37._8_8_ = dStack_b0;
        auVar37._0_8_ = local_b8;
        auVar37 = vunpcklpd_avx(auVar37,local_d8);
        local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = dVar33 * auVar37._0_8_ +
                   (double)local_f8._0_8_ * local_e8 + (double)local_f8._8_8_ * dStack_e0;
        local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = dVar33 * auVar37._8_8_ +
                   (double)local_f8._0_8_ * local_58 + (double)local_f8._8_8_ * dStack_50;
        local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = dVar33 * local_98 +
                   (double)local_f8._0_8_ * local_a8 + (double)local_f8._8_8_ * dStack_a0;
        iVar7._M_current = *(Matrix<double,_3,_1,_0,_3,_1> **)(local_110 + 8);
        if (iVar7._M_current == *(Matrix<double,_3,_1,_0,_3,_1> **)(local_110 + 0x10)) {
          std::
          vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
          ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>(local_110,iVar7,&local_138);
          dVar33 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0];
        }
        else {
          ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[2] =
               local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
          ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[0] =
               local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
          ((iVar7._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[1] =
               local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
          *(long *)(local_110 + 8) = *(long *)(local_110 + 8) + 0x18;
          dVar33 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0];
        }
        local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0]._4_4_ = (undefined4)((ulong)dVar33 >> 0x20);
        lVar22 = *(long *)pvVar11;
        auVar37 = *(undefined1 (*) [16])(lVar22 + uVar24 * 0x18);
        dVar26 = *(double *)(lVar22 + 0x10 + uVar24 * 0x18);
        auVar31._8_8_ = 0;
        auVar31._0_8_ =
             dVar26 * dVar26 + auVar37._0_8_ * auVar37._0_8_ + auVar37._8_8_ * auVar37._8_8_;
        auVar30 = vsqrtpd_avx(auVar31);
        dVar29 = auVar30._0_8_;
        auVar35._8_8_ = dVar29;
        auVar35._0_8_ = dVar29;
        auVar37 = vdivpd_avx(auVar37,auVar35);
        *(undefined1 (*) [16])(lVar22 + uVar24 * 0x18) = auVar37;
        *(double *)(lVar22 + 0x10 + uVar24 * 0x18) = dVar26 / dVar29;
        if (0.0 < local_100) {
          lVar22 = *(long *)pvVar11;
          lVar18 = uVar24 * 0x18;
          local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = *(double *)(lVar22 + 0x10 + lVar18);
          pdVar4 = (double *)(lVar22 + lVar18);
          local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = *pdVar4;
          local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = pdVar4[1];
          local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = dVar33;
          addNoise(&local_138,local_100,&local_48);
          lVar22 = *(long *)local_110;
          *(double *)(lVar22 + 0x10 + lVar18) =
               local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
          pdVar4 = (double *)(lVar22 + lVar18);
          *pdVar4 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data.array[0];
          pdVar4[1] = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[1];
        }
        local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0]._0_4_ = (int)uVar23;
        __position._M_current =
             (camCorrespondences->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (camCorrespondences->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (camCorrespondences,__position,(int *)&local_138);
        }
        else {
          *__position._M_current =
               local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0]._0_4_;
          (camCorrespondences->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        auVar37 = in_ZMM5._0_16_;
        uVar23 = uVar23 + 1;
        if (local_70 < uVar23) {
          uVar23 = 0;
        }
        local_120 = (double)((long)local_120 + 8);
        uVar24 = uVar24 + 1;
      } while (uVar24 < (ulong)(gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                               ).m_storage.m_cols);
    }
  }
  prVar12 = local_108;
  ptVar10 = local_118;
  auVar37 = vcvtusi2sd_avx512f(auVar37,local_80);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = auVar37._0_8_ * local_78;
  auVar37 = vroundsd_avx(auVar27,auVar27,9);
  lVar22 = vcvttsd2usi_avx512f(auVar37);
  if (lVar22 != 0) {
    lVar25 = 4;
    lVar18 = 0;
    local_68 = position;
    do {
      pMVar8 = (ptVar10->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      iVar3 = (camCorrespondences->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar18];
      pMVar5 = pMVar8 + iVar3;
      local_e8 = (pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                 m_data.array[0];
      dStack_e0 = *(double *)
                   ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                           m_storage.m_data + 8);
      local_a8 = *(double *)
                  ((long)&pMVar8[iVar3].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                          .m_storage.m_data + 0x10);
      pMVar6 = (prVar12->
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_b8 = pMVar6[iVar3].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                 m_storage.m_data.array[0];
      dStack_b0 = *(double *)
                   ((long)&pMVar6[iVar3].
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data + 8);
      pdVar4 = (double *)
               ((long)&pMVar6[iVar3].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data + 0x18);
      local_c8 = *pdVar4;
      dStack_c0 = pdVar4[1];
      pdVar4 = (double *)
               ((long)&pMVar6[iVar3].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data + 0x30);
      local_98 = *pdVar4;
      dStack_90 = pdVar4[1];
      local_120 = *(double *)
                   ((long)&pMVar6[iVar3].
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                           m_data + 0x40);
      auVar28._8_8_ = 0;
      auVar28._0_8_ =
           *(double *)
            ((long)&pMVar6[iVar3].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data + 0x10);
      local_d8 = vmovhps_avx(auVar28,*(double *)
                                      ((long)&pMVar6[iVar3].
                                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                              .m_storage.m_data + 0x28));
      generateRandomPoint(&local_138,8.0,4.0);
      auVar14._4_4_ =
           local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0]._4_4_;
      auVar14._0_4_ =
           local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0]._0_4_;
      auVar14._8_8_ =
           local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
      lVar18 = lVar18 + 1;
      auVar37 = vmovhpd_avx(*(undefined1 (*) [16])
                             ((rotation->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array + 2),
                            (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                            .m_storage.m_data.array[5]);
      auVar30 = vsubpd_avx(auVar14,*(undefined1 (*) [16])
                                    (local_68->
                                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                    m_storage.m_data.array);
      dVar33 = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] -
               (local_68->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
      lVar9 = *(long *)local_110;
      dVar26 = auVar30._0_8_;
      dVar29 = auVar30._8_8_;
      auVar34._0_8_ =
           dVar33 * auVar37._0_8_ +
           dVar26 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[0] +
           dVar29 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[1];
      auVar34._8_8_ =
           dVar33 * auVar37._8_8_ +
           dVar26 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[3] +
           dVar29 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[4];
      auVar15._8_8_ = dStack_e0;
      auVar15._0_8_ = local_e8;
      auVar37 = vsubpd_avx(auVar34,auVar15);
      local_a8 = (dVar33 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data.array[8] +
                 dVar26 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[6] +
                 dVar29 * (rotation->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                          m_storage.m_data.array[7]) - local_a8;
      dVar33 = auVar37._0_8_;
      dVar26 = auVar37._8_8_;
      pdVar4 = (double *)(lVar9 + -0x10 + lVar25 * 4);
      *pdVar4 = local_a8 * (double)local_d8._0_8_ + dVar33 * local_b8 + dVar26 * dStack_b0;
      pdVar4[1] = local_a8 * (double)local_d8._8_8_ + dVar33 * local_c8 + dVar26 * dStack_c0;
      *(double *)(lVar9 + lVar25 * 4) =
           local_a8 * local_120 + dVar33 * local_98 + dVar26 * dStack_90;
      lVar9 = *(long *)local_110;
      auVar37 = *(undefined1 (*) [16])(lVar9 + -0x10 + lVar25 * 4);
      dVar33 = *(double *)(lVar9 + lVar25 * 4);
      auVar32._8_8_ = 0;
      auVar32._0_8_ =
           dVar33 * dVar33 + auVar37._0_8_ * auVar37._0_8_ + auVar37._8_8_ * auVar37._8_8_;
      auVar30 = vsqrtpd_avx(auVar32);
      dVar26 = auVar30._0_8_;
      auVar36._8_8_ = dVar26;
      auVar36._0_8_ = dVar26;
      auVar37 = vdivpd_avx(auVar37,auVar36);
      *(undefined1 (*) [16])(lVar9 + -0x10 + lVar25 * 4) = auVar37;
      *(double *)(lVar9 + lVar25 * 4) = dVar33 / dVar26;
      lVar25 = lVar25 + 6;
    } while (lVar22 != lVar18);
  }
  return;
}

Assistant:

void
opengv::generateRandom2D3DCorrespondences(
    const translation_t & position,
    const rotation_t & rotation,
    const translations_t & camOffsets,
    const rotations_t & camRotations,
    size_t numberPoints,
    double noise,
    double outlierFraction,
    bearingVectors_t & bearingVectors,
    points_t & points,
    std::vector<int> & camCorrespondences,
    Eigen::MatrixXd & gt )
{
  //initialize point-cloud
  double minDepth = 4;
  double maxDepth = 8;

  for( size_t i = 0; i < (size_t) gt.cols(); i++ )
    gt.col(i) = generateRandomPoint( maxDepth, minDepth );

  //create the 2D3D-correspondences by looping through the cameras
  size_t numberCams = camOffsets.size();
  size_t camCorrespondence = 0;

  for( size_t i = 0; i < (size_t) gt.cols(); i++ )
  {
    //get the camera transformation
    translation_t camOffset = camOffsets[camCorrespondence];
    rotation_t camRotation = camRotations[camCorrespondence];

    //store the point
    points.push_back(gt.col(i));

    //project the point into the viewpoint frame
    point_t bodyPoint = rotation.transpose()*(gt.col(i) - position);

    //project the point into the camera frame
    bearingVectors.push_back(camRotation.transpose()*(bodyPoint - camOffset));

    //normalize the bearing-vector to 1
    bearingVectors[i] = bearingVectors[i] / bearingVectors[i].norm();

    //add noise
    if( noise > 0.0 )
      bearingVectors[i] = addNoise(noise,bearingVectors[i]);

    //push back the camera correspondence
    camCorrespondences.push_back(camCorrespondence++);
    if(camCorrespondence > (numberCams-1) )
      camCorrespondence = 0;
  }

  //add outliers
  //compute the number of outliers based on fraction
  size_t numberOutliers = (size_t) floor(outlierFraction*numberPoints);
  //make the first numberOutliers points be outliers
  for(size_t i = 0; i < numberOutliers; i++)
  {
    //extract the camera transformation
    translation_t camOffset = camOffsets[camCorrespondences[i]];
    rotation_t camRotation = camRotations[camCorrespondences[i]];

    //create random point
    point_t p = generateRandomPoint(8,4);

    //project into viewpoint frame
    point_t bodyPoint = rotation.transpose()*(p - position);

    //project into camera-frame and use as outlier measurement
    bearingVectors[i] = camRotation.transpose()*(bodyPoint - camOffset);

    //normalize the bearing vector
    bearingVectors[i] = bearingVectors[i] / bearingVectors[i].norm();
  }
}